

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ssh_ntru_server_getpublic(ecdh_key *dh,BinarySink *bs)

{
  ptrlen pl;
  ptrlen pl_00;
  
  pl.ptr = (dh[-3].vt)->free;
  pl.len = (size_t)(dh[-3].vt)->getpublic;
  BinarySink_put_datapl(bs->binarysink_,pl);
  pl_00.ptr = (dh[-2].vt)->free;
  pl_00.len = (size_t)(dh[-2].vt)->getpublic;
  BinarySink_put_datapl(bs->binarysink_,pl_00);
  (**(code **)((dh[-1].vt)->new + 0x10))(dh[-1].vt,bs);
  return;
}

Assistant:

static void ssh_ntru_server_getpublic(ecdh_key *dh, BinarySink *bs)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);

    /*
     * In the server, this function is called after getkey, so we
     * already have all our pieces prepared. Just concatenate them all
     * into the 'server's public data' string to go in ECDH_REPLY.
     */
    put_datapl(bs, ptrlen_from_strbuf(nk->ciphertext_encoded));
    put_datapl(bs, ptrlen_from_strbuf(nk->confirmation_hash));
    ecdh_key_getpublic(nk->curve25519, bs);
}